

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_opcode_ds(Context *ctx,char *opcode)

{
  char local_98 [8];
  char src0 [64];
  char dst [64];
  char *opcode_local;
  Context *ctx_local;
  
  make_ARB1_destarg_string(ctx,src0 + 0x38,0x40);
  make_ARB1_srcarg_string(ctx,0,local_98,0x40);
  output_line(ctx,"%s%s, %s;",opcode,src0 + 0x38,local_98);
  emit_ARB1_dest_modifiers(ctx);
  return;
}

Assistant:

static void emit_ARB1_opcode_ds(Context *ctx, const char *opcode)
{
    char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));
    char src0[64]; make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));
    output_line(ctx, "%s%s, %s;", opcode, dst, src0);
    emit_ARB1_dest_modifiers(ctx);
}